

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O1

_Bool conf_deserialise(Conf *conf,BinarySource *src)

{
  unsigned_long uVar1;
  conf_entry *entry;
  char *pcVar2;
  FontSpec *pFVar3;
  uint uVar4;
  _Bool _Var5;
  
  uVar1 = BinarySource_get_uint32(src->binarysource_);
  if (src->binarysource_->err == BSE_NO_ERROR) {
    do {
      uVar4 = (uint)uVar1;
      if (0xcd < uVar4) break;
      entry = (conf_entry *)safemalloc(1,0x18,0);
      (entry->key).primary = uVar4;
      if (subkeytypes[uVar1 & 0xff] == 3) {
        pcVar2 = BinarySource_get_asciz(src->binarysource_);
        pcVar2 = dupstr(pcVar2);
        (entry->key).secondary.s = pcVar2;
      }
      else if (subkeytypes[uVar1 & 0xff] == 2) {
        uVar1 = BinarySource_get_uint32(src->binarysource_);
        (entry->key).secondary.i = (int)uVar1;
      }
      switch(valuetypes[(entry->key).primary]) {
      case 1:
        _Var5 = BinarySource_get_bool(src->binarysource_);
        (entry->value).u.boolval = _Var5;
        break;
      case 2:
        uVar1 = BinarySource_get_uint32(src->binarysource_);
        (entry->value).u.intval = (int)uVar1;
        break;
      case 3:
        pcVar2 = BinarySource_get_asciz(src->binarysource_);
        pFVar3 = (FontSpec *)dupstr(pcVar2);
        goto LAB_0016c577;
      case 4:
        pFVar3 = (FontSpec *)filename_deserialise(src);
        goto LAB_0016c577;
      case 5:
        pFVar3 = fontspec_deserialise(src);
LAB_0016c577:
        (entry->value).u.fontval = pFVar3;
      }
      if (src->binarysource_->err != BSE_NO_ERROR) {
        free_entry(entry);
        goto LAB_0016c4b5;
      }
      conf_insert(conf,entry);
      uVar1 = BinarySource_get_uint32(src->binarysource_);
    } while (src->binarysource_->err == BSE_NO_ERROR);
    _Var5 = uVar4 == 0xffffffff;
  }
  else {
LAB_0016c4b5:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool conf_deserialise(Conf *conf, BinarySource *src)
{
    struct conf_entry *entry;
    unsigned primary;

    while (1) {
        primary = get_uint32(src);

        if (get_err(src))
            return false;
        if (primary == 0xFFFFFFFFU)
            return true;
        if (primary >= N_CONFIG_OPTIONS)
            return false;

        entry = snew(struct conf_entry);
        entry->key.primary = primary;

        switch (subkeytypes[entry->key.primary]) {
          case TYPE_INT:
            entry->key.secondary.i = toint(get_uint32(src));
            break;
          case TYPE_STR:
            entry->key.secondary.s = dupstr(get_asciz(src));
            break;
        }

        switch (valuetypes[entry->key.primary]) {
          case TYPE_BOOL:
            entry->value.u.boolval = get_bool(src);
            break;
          case TYPE_INT:
            entry->value.u.intval = toint(get_uint32(src));
            break;
          case TYPE_STR:
            entry->value.u.stringval = dupstr(get_asciz(src));
            break;
          case TYPE_FILENAME:
            entry->value.u.fileval = filename_deserialise(src);
            break;
          case TYPE_FONT:
            entry->value.u.fontval = fontspec_deserialise(src);
            break;
        }

        if (get_err(src)) {
            free_entry(entry);
            return false;
        }

        conf_insert(conf, entry);
    }
}